

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

void alsa_destroy(cubeb_conflict1 *ctx)

{
  void *in_RDI;
  int r;
  
  pthread_mutex_lock((pthread_mutex_t *)((long)in_RDI + 0x18));
  *(undefined4 *)((long)in_RDI + 0xd4) = 1;
  poll_wake((cubeb_conflict1 *)0x13f1d0);
  pthread_mutex_unlock((pthread_mutex_t *)((long)in_RDI + 0x18));
  pthread_join(*(pthread_t *)((long)in_RDI + 0x10),(void **)0x0);
  close(*(int *)((long)in_RDI + 0xd8));
  close(*(int *)((long)in_RDI + 0xdc));
  pthread_mutex_destroy((pthread_mutex_t *)((long)in_RDI + 0x18));
  free(*(void **)((long)in_RDI + 0xc0));
  if (*(long *)((long)in_RDI + 0xe8) != 0) {
    pthread_mutex_lock((pthread_mutex_t *)&cubeb_alsa_mutex);
    (*cubeb_snd_config_delete)(*(snd_config_t **)((long)in_RDI + 0xe8));
    pthread_mutex_unlock((pthread_mutex_t *)&cubeb_alsa_mutex);
  }
  if (*(long *)((long)in_RDI + 8) != 0) {
    dlclose(*(undefined8 *)((long)in_RDI + 8));
  }
  free(in_RDI);
  return;
}

Assistant:

static void
alsa_destroy(cubeb * ctx)
{
  int r;

  assert(ctx);

  pthread_mutex_lock(&ctx->mutex);
  ctx->shutdown = 1;
  poll_wake(ctx);
  pthread_mutex_unlock(&ctx->mutex);

  r = pthread_join(ctx->thread, NULL);
  assert(r == 0);

  close(ctx->control_fd_read);
  close(ctx->control_fd_write);
  pthread_mutex_destroy(&ctx->mutex);
  free(ctx->fds);

  if (ctx->local_config) {
    pthread_mutex_lock(&cubeb_alsa_mutex);
    WRAP(snd_config_delete)(ctx->local_config);
    pthread_mutex_unlock(&cubeb_alsa_mutex);
  }

  if (ctx->libasound) {
    dlclose(ctx->libasound);
  }

  free(ctx);
}